

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O3

string * __thiscall
tinyusdz::primvar::PrimVar::type_name_abi_cxx11_(string *__return_storage_ptr__,PrimVar *this)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  
  if (((this->_blocked == false) &&
      (pvVar1 = (this->_value).v_.vtable, pvVar1 != (vtable_type *)0x0)) &&
     ((uVar2 = (*pvVar1->type_id)(), uVar2 == 0 ||
      ((pvVar1 = (this->_value).v_.vtable, pvVar1 != (vtable_type *)0x0 &&
       (uVar2 = (*pvVar1->type_id)(), uVar2 == 1)))))) {
    if ((this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      tinyusdz::value::TimeSamples::type_name_abi_cxx11_(__return_storage_ptr__,&this->_ts);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"[[InvalidType]]","");
    return __return_storage_ptr__;
  }
  pvVar1 = (this->_value).v_.vtable;
  if (pvVar1 == (vtable_type *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    *(undefined4 *)&__return_storage_ptr__->field_2 = 0x64696f76;
    __return_storage_ptr__->_M_string_length = 4;
    (__return_storage_ptr__->field_2)._M_local_buf[4] = '\0';
  }
  else {
    (*pvVar1->type_name)(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string type_name() const {
    if (has_default()) {
      return _value.type_name();
    }
      
    if (has_timesamples()) {
      return _ts.type_name();
    }

    return "[[InvalidType]]";
  }